

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::RoundEvenCase::compare(RoundEvenCase *this,void **inputs,void **outputs)

{
  float fVar1;
  Precision PVar2;
  pointer pSVar3;
  void *pvVar4;
  void *pvVar5;
  deUint32 aBits;
  uint uVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  bool bVar10;
  uint uVar11;
  ostringstream *poVar12;
  int iVar13;
  float fVar14;
  ulong uVar15;
  deUint32 bBits;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  Hex<8UL> local_40;
  HexFloat local_34;
  
  pSVar3 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar2 = (pSVar3->varType).m_data.basic.precision;
  uVar6 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  if (PVar2 - PRECISION_MEDIUMP < 2) {
    if ((int)uVar6 < 1) {
      return true;
    }
    pvVar4 = *inputs;
    pvVar5 = *outputs;
    uVar15 = 0;
    do {
      fVar14 = *(float *)((long)pvVar4 + uVar15 * 4);
      fVar17 = *(float *)((long)pvVar5 + uVar15 * 4);
      fVar16 = floorf(fVar14);
      fVar16 = fVar14 - fVar16;
      iVar7 = (int)(fVar14 - fVar16);
      if (fVar16 <= 0.5) {
        iVar7 = iVar7 + (uint)((byte)iVar7 & fVar16 == 0.5);
      }
      else {
        iVar7 = iVar7 + 1;
      }
      fVar16 = (float)iVar7;
      if (PVar2 == PRECISION_HIGHP) {
LAB_00470c66:
        fVar14 = (float)((int)fVar16 - (int)fVar17);
        if ((uint)fVar16 < (uint)fVar17) {
          fVar14 = (float)-((int)fVar16 - (int)fVar17);
        }
      }
      else if ((fVar17 != 0.0) || (NAN(fVar17))) {
        if (iVar7 != 0) goto LAB_00470c66;
        fVar14 = ABS(fVar17);
      }
      else {
        fVar14 = ABS(fVar16);
      }
      if (fVar14 != 0.0) {
        poVar12 = &(this->super_CommonFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,"Expected [",10);
        poVar9 = (ostream *)std::ostream::operator<<(poVar12,(int)uVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] = ",4);
        local_34.value = fVar16;
        poVar9 = Functional::operator<<(poVar9,&local_34);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,", got ULP diff ",0xf);
LAB_00470f6d:
        local_40.value = (deUint64)(uint)fVar14;
        tcu::Format::Hex<8UL>::toStream(&local_40,poVar9);
        return false;
      }
      uVar15 = uVar15 + 1;
    } while (uVar6 != uVar15);
  }
  else {
    uVar11 = -1 << (0x17 - (&DAT_00986d1c)[(ulong)PVar2 * 4] & 0x1f);
    if ((int)uVar6 < 1) {
      return true;
    }
    fVar17 = (float)(uVar11 & 0x7fffff ^ 0x3fffffff) + -1.0;
    fVar14 = (float)~uVar11;
    pvVar4 = *inputs;
    pvVar5 = *outputs;
    uVar15 = 0;
    do {
      fVar16 = *(float *)((long)pvVar4 + uVar15 * 4);
      fVar1 = *(float *)((long)pvVar5 + uVar15 * 4);
      fVar18 = fVar16 - fVar17;
      fVar19 = floorf(fVar18);
      fVar19 = fVar18 - fVar19;
      iVar7 = (int)(fVar18 - fVar19);
      if (fVar19 <= 0.5) {
        iVar7 = iVar7 + (uint)((byte)iVar7 & fVar19 == 0.5);
      }
      else {
        iVar7 = iVar7 + 1;
      }
      fVar16 = fVar16 + fVar17;
      fVar18 = floorf(fVar16);
      fVar18 = fVar16 - fVar18;
      iVar8 = (int)(fVar16 - fVar18);
      if (fVar18 <= 0.5) {
        iVar8 = iVar8 + (uint)((byte)iVar8 & fVar18 == 0.5);
      }
      else {
        iVar8 = iVar8 + 1;
      }
      iVar7 = (int)(float)iVar7;
      iVar8 = (int)(float)iVar8;
      if (iVar8 < iVar7) {
LAB_00470e6a:
        poVar12 = &(this->super_CommonFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,"Expected [",10);
        poVar9 = (ostream *)std::ostream::operator<<(poVar12,(int)uVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] = [",5);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] with ULP threshold ",0x15);
        goto LAB_00470f6d;
      }
      bVar10 = false;
      iVar13 = iVar7;
      do {
        fVar16 = (float)iVar13;
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          fVar18 = ABS(fVar1);
          if (iVar13 != 0) {
            fVar18 = (float)((int)fVar16 - (int)fVar1);
            if ((uint)fVar16 < (uint)fVar1) {
              fVar18 = (float)-((int)fVar16 - (int)fVar1);
            }
          }
        }
        else {
          fVar18 = ABS(fVar16);
        }
        if ((uint)fVar18 <= (uint)fVar14) {
          bVar10 = true;
          break;
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 <= iVar8);
      if (!bVar10) goto LAB_00470e6a;
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar6);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const bool				hasSignedZero	= supportsSignedZero(precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP || precision == glu::PRECISION_MEDIUMP)
		{
			// Require exact rounding result.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const float		ref			= roundEven(in0);

				const deUint32	ulpDiff		= hasSignedZero ? getUlpDiff(out0, ref) : getUlpDiffIgnoreZeroSign(out0, ref);

				if (ulpDiff > 0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << ", got ULP diff " << tcu::toHex(ulpDiff);
					return false;
				}
			}
		}
		else
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const deUint32	maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);	// ULP diff for rounded integer value.
			const float		eps				= getEpsFromBits(1.0f, mantissaBits);	// epsilon for rounding bounds

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const int		minRes		= int(roundEven(in0-eps));
				const int		maxRes		= int(roundEven(in0+eps));
				bool			anyOk		= false;

				for (int roundedVal = minRes; roundedVal <= maxRes; roundedVal++)
				{
					const deUint32 ulpDiff = getUlpDiffIgnoreZeroSign(out0, float(roundedVal));

					if (ulpDiff <= maxUlpDiff)
					{
						anyOk = true;
						break;
					}
				}

				if (!anyOk)
				{
					m_failMsg << "Expected [" << compNdx << "] = [" << minRes << ", " << maxRes << "] with ULP threshold " << tcu::toHex(maxUlpDiff);
					return false;
				}
			}
		}

		return true;
	}